

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile.hpp
# Opt level: O3

bool __thiscall
ruckig::Profile::check<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7,false>
          (Profile *this,double jf,double vMax,double vMin,double aMax,double aMin)

{
  double dVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar7 = (this->t)._M_elems[0];
  if (0.0 <= dVar7) {
    (this->t_sum)._M_elems[0] = dVar7;
    lVar2 = 1;
    do {
      dVar10 = (this->t)._M_elems[lVar2];
      if (dVar10 < 0.0) {
        return false;
      }
      dVar7 = dVar7 + dVar10;
      (this->t_sum)._M_elems[lVar2] = dVar7;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 7);
    if ((this->t_sum)._M_elems[6] <= 1000000000000.0) {
      dVar7 = (this->t)._M_elems[2];
      dVar10 = (this->t)._M_elems[4];
      dVar4 = (this->t)._M_elems[6];
      (this->j)._M_elems[0] = (double)(-(ulong)(0.0 < (this->t)._M_elems[0]) & (ulong)jf);
      uVar3 = 0;
      (this->j)._M_elems[1] = 0.0;
      (this->j)._M_elems[2] = (double)(-(ulong)(0.0 < dVar7) & (ulong)-jf);
      (this->j)._M_elems[3] = 0.0;
      (this->j)._M_elems[4] = (double)(-(ulong)(0.0 < dVar10) & (ulong)jf);
      (this->j)._M_elems[5] = 0.0;
      (this->j)._M_elems[6] = (double)(-(ulong)(0.0 < dVar4) & (ulong)-jf);
      this->direction = (uint)(vMax <= 0.0);
      dVar7 = vMax;
      if (0.0 < vMax) {
        dVar7 = vMin;
        vMin = vMax;
      }
      dVar8 = vMin + 1e-12;
      dVar7 = dVar7 + -1e-12;
      dVar10 = (this->p)._M_elems[0];
      dVar4 = (this->a)._M_elems[0];
      dVar12 = (this->v)._M_elems[0];
      do {
        dVar1 = (this->t)._M_elems[uVar3];
        dVar6 = (this->j)._M_elems[uVar3];
        dVar9 = dVar1 * dVar6;
        dVar5 = dVar9 + dVar4;
        (this->a)._M_elems[uVar3 + 1] = dVar5;
        dVar11 = (dVar9 * 0.5 + dVar4) * dVar1 + dVar12;
        (this->v)._M_elems[uVar3 + 1] = dVar11;
        dVar10 = ((dVar9 / 6.0 + dVar4 * 0.5) * dVar1 + dVar12) * dVar1 + dVar10;
        (this->p)._M_elems[uVar3 + 1] = dVar10;
        if ((1 < uVar3) && (dVar4 * dVar5 < -2.220446049250313e-16)) {
          dVar12 = dVar12 - (dVar4 * dVar4) / (dVar6 + dVar6);
          if (dVar8 < dVar12) {
            return false;
          }
          if (dVar12 < dVar7) {
            return false;
          }
        }
        uVar3 = uVar3 + 1;
        dVar4 = dVar5;
        dVar12 = dVar11;
      } while (uVar3 != 7);
      this->control_signs = UDUD;
      this->limits = NONE;
      dVar10 = aMax;
      if (0.0 < vMax) {
        dVar10 = aMin;
      }
      if (((ABS((this->p)._M_elems[7] - this->pf) < 1e-08) &&
          (ABS((this->v)._M_elems[7] - this->vf) < 1e-08)) &&
         (ABS((this->a)._M_elems[7] - this->af) < 1e-10)) {
        dVar10 = dVar10 + -1e-12;
        dVar4 = (this->a)._M_elems[1];
        if ((dVar10 <= dVar4) && (dVar12 = (this->a)._M_elems[3], dVar10 <= dVar12)) {
          dVar6 = (double)(~-(ulong)(vMax <= 0.0) & (ulong)aMax |
                          (ulong)aMin & -(ulong)(vMax <= 0.0)) + 1e-12;
          dVar1 = (this->a)._M_elems[5];
          if ((((dVar1 <= dVar6) && ((dVar12 <= dVar6 && (dVar4 <= dVar6)))) && (dVar10 <= dVar1))
             && (((dVar10 = (this->v)._M_elems[3], dVar10 <= dVar8 &&
                  (dVar4 = (this->v)._M_elems[4], dVar4 <= dVar8)) &&
                 (dVar12 = (this->v)._M_elems[5], dVar12 <= dVar8)))) {
            dVar1 = (this->v)._M_elems[6];
            return (bool)((dVar7 <= dVar1 && (dVar7 <= dVar12 && dVar1 <= dVar8)) &
                         -(dVar7 <= dVar10) & -(dVar7 <= dVar4));
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool check(double jf, double vMax, double vMin, double aMax, double aMin) {
        if (t[0] < 0) {
            return false;
        }

        t_sum[0] = t[0];
        for (size_t i = 0; i < 6; ++i) {
            if (t[i+1] < 0) {
                return false;
            }

            t_sum[i+1] = t_sum[i] + t[i+1];
        }

        if constexpr (limits == ReachedLimits::ACC0_ACC1_VEL || limits == ReachedLimits::ACC0_VEL || limits == ReachedLimits::ACC1_VEL || limits == ReachedLimits::VEL) {
            if (t[3] < std::numeric_limits<double>::epsilon()) {
                return false;
            }
        }

        if constexpr (limits == ReachedLimits::ACC0 || limits == ReachedLimits::ACC0_ACC1) {
            if (t[1] < std::numeric_limits<double>::epsilon()) {
                return false;
            }
        }

        if constexpr (limits == ReachedLimits::ACC1 || limits == ReachedLimits::ACC0_ACC1) {
            if (t[5] < std::numeric_limits<double>::epsilon()) {
                return false;
            }
        }

        if (t_sum.back() > t_max) { // For numerical reasons, is that needed?
            return false;
        }

        if constexpr (control_signs == ControlSigns::UDDU) {
            j = {(t[0] > 0 ? jf : 0), 0, (t[2] > 0 ? -jf : 0), 0, (t[4] > 0 ? -jf : 0), 0, (t[6] > 0 ? jf : 0)};
        } else {
            j = {(t[0] > 0 ? jf : 0), 0, (t[2] > 0 ? -jf : 0), 0, (t[4] > 0 ? jf : 0), 0, (t[6] > 0 ? -jf : 0)};
        }

        direction = (vMax > 0) ? Profile::Direction::UP : Profile::Direction::DOWN;
        const double vUppLim = (direction == Profile::Direction::UP ? vMax : vMin) + v_eps;
        const double vLowLim = (direction == Profile::Direction::UP ? vMin : vMax) - v_eps;

        for (size_t i = 0; i < 7; ++i) {
            a[i+1] = a[i] + t[i] * j[i];
            v[i+1] = v[i] + t[i] * (a[i] + t[i] * j[i] / 2);
            p[i+1] = p[i] + t[i] * (v[i] + t[i] * (a[i] / 2 + t[i] * j[i] / 6));

            if constexpr (limits == ReachedLimits::ACC0_ACC1_VEL || limits == ReachedLimits::ACC0_ACC1 || limits == ReachedLimits::ACC0_VEL || limits == ReachedLimits::ACC1_VEL || limits == ReachedLimits::VEL) {
                if (i == 2) {
                    a[3] = 0.0;
                }
            }

            if constexpr (set_limits) {
                if constexpr (limits == ReachedLimits::ACC1) {
                    if (i == 2) {
                        a[3] = aMin;
                    }
                }

                if constexpr (limits == ReachedLimits::ACC0_ACC1) {
                    if (i == 0) {
                        a[1] = aMax;
                    }

                    if (i == 4) {
                        a[5] = aMin;
                    }
                }
            }

            if (i > 1 && a[i+1] * a[i] < -std::numeric_limits<double>::epsilon()) {
                const double v_a_zero = v[i] - (a[i] * a[i]) / (2 * j[i]);
                if (v_a_zero > vUppLim || v_a_zero < vLowLim) {
                    return false;
                }
            }
        }

        this->control_signs = control_signs;
        this->limits = limits;

        const double aUppLim = (direction == Profile::Direction::UP ? aMax : aMin) + a_eps;
        const double aLowLim = (direction == Profile::Direction::UP ? aMin : aMax) - a_eps;

        // Velocity limit can be broken in the beginning if both initial velocity and acceleration are too high
        // std::cout << std::setprecision(16) << "target: " << std::abs(p.back() - pf) << " " << std::abs(v.back() - vf) << " " << std::abs(a.back() - af) << " T: " << t_sum.back() << " " << to_string() << std::endl;
        return std::abs(p.back() - pf) < p_precision && std::abs(v.back() - vf) < v_precision && std::abs(a.back() - af) < a_precision
            && a[1] >= aLowLim && a[3] >= aLowLim && a[5] >= aLowLim
            && a[1] <= aUppLim && a[3] <= aUppLim && a[5] <= aUppLim
            && v[3] <= vUppLim && v[4] <= vUppLim && v[5] <= vUppLim && v[6] <= vUppLim
            && v[3] >= vLowLim && v[4] >= vLowLim && v[5] >= vLowLim && v[6] >= vLowLim;
    }